

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O3

Iterator * __thiscall leveldb::DBImpl::NewIterator(DBImpl *this,ReadOptions *options)

{
  Iterator *pIVar1;
  Snapshot *pSVar2;
  long in_FS_OFFSET;
  uint32_t seed;
  SequenceNumber latest_snapshot;
  uint32_t local_34;
  Snapshot local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pIVar1 = NewInternalIterator(this,options,(SequenceNumber *)&local_30,&local_34);
  pSVar2 = options->snapshot + 3;
  if (options->snapshot == (Snapshot *)0x0) {
    pSVar2 = &local_30;
  }
  pIVar1 = NewDBIterator(this,(this->internal_comparator_).user_comparator_,pIVar1,
                         (SequenceNumber)pSVar2->_vptr_Snapshot,local_34);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pIVar1;
  }
  __stack_chk_fail();
}

Assistant:

Iterator* DBImpl::NewIterator(const ReadOptions& options) {
  SequenceNumber latest_snapshot;
  uint32_t seed;
  Iterator* iter = NewInternalIterator(options, &latest_snapshot, &seed);
  return NewDBIterator(this, user_comparator(), iter,
                       (options.snapshot != nullptr
                            ? static_cast<const SnapshotImpl*>(options.snapshot)
                                  ->sequence_number()
                            : latest_snapshot),
                       seed);
}